

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O3

void DLoadSaveMenu::NotifyNewSave(char *file,char *title,bool okForQuicksave)

{
  FSaveGameNode **ppFVar1;
  int iVar2;
  uint uVar3;
  FSaveGameNode *__dest;
  ulong uVar4;
  ulong uVar5;
  
  if (file != (char *)0x0) {
    ReadSaveStrings();
    ppFVar1 = SaveGames.Array;
    uVar4 = (ulong)SaveGames.Count;
    if (uVar4 != 0) {
      uVar5 = 0;
      do {
        __dest = ppFVar1[uVar5];
        iVar2 = strcmp((__dest->Filename).Chars,file);
        if (iVar2 == 0) {
          strcpy(__dest->Title,title);
          __dest->bOldVersion = false;
          __dest->bMissingWads = false;
          if (!okForQuicksave) {
            return;
          }
          goto LAB_003344fa;
        }
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    __dest = (FSaveGameNode *)operator_new(0x28);
    (__dest->Filename).Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    __dest->bNoDelete = false;
    strcpy((char *)__dest,title);
    FString::operator=(&__dest->Filename,file);
    __dest->bOldVersion = false;
    __dest->bMissingWads = false;
    uVar3 = InsertSaveNode((FSaveGameNode *)0x3344d5);
    if (okForQuicksave) {
      uVar5 = (ulong)uVar3;
LAB_003344fa:
      if (quickSaveSlot == (FSaveGameNode *)0x0) {
        quickSaveSlot = __dest;
      }
      LastSaved = (int)uVar5;
      LastAccessed = LastSaved;
    }
  }
  return;
}

Assistant:

void DLoadSaveMenu::NotifyNewSave (const char *file, const char *title, bool okForQuicksave)
{
	FSaveGameNode *node;

	if (file == NULL)
		return;

	ReadSaveStrings ();

	// See if the file is already in our list
	for (unsigned i=0; i<SaveGames.Size(); i++)
	{
		FSaveGameNode *node = SaveGames[i];
#ifdef __unix__
		if (node->Filename.Compare (file) == 0)
#else
		if (node->Filename.CompareNoCase (file) == 0)
#endif
		{
			strcpy (node->Title, title);
			node->bOldVersion = false;
			node->bMissingWads = false;
			if (okForQuicksave)
			{
				if (quickSaveSlot == NULL) quickSaveSlot = node;
				LastAccessed = LastSaved = i;
			}
			return;
		}
	}

	node = new FSaveGameNode;
	strcpy (node->Title, title);
	node->Filename = file;
	node->bOldVersion = false;
	node->bMissingWads = false;
	int index = InsertSaveNode (node);

	if (okForQuicksave)
	{
		if (quickSaveSlot == NULL) quickSaveSlot = node;
		LastAccessed = LastSaved = index;
	}
}